

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O3

void idx2::Init(decode_data *D,idx2_file *Idx2,allocator *Alloc)

{
  Init(&D->BrickPool,Idx2);
  if (Alloc == (allocator *)0x0) {
    Alloc = (allocator *)BrickAlloc_;
  }
  D->Alloc = Alloc;
  if (Mallocator()::Instance == '\0') {
    Init();
  }
  Init<unsigned_long,idx2::file_cache>(&D->FileCacheTable,8,(allocator *)&Mallocator()::Instance);
  return;
}

Assistant:

void
Init(decode_data* D, const idx2_file* Idx2, allocator* Alloc)
{
  Init(&D->BrickPool, Idx2);
  D->Alloc = Alloc ? Alloc : &BrickAlloc_;
  Init(&D->FileCacheTable);
#if VISUS_IDX2
  Init(&D->FileCache);
#endif
}